

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffs.h
# Opt level: O2

void __thiscall libDAI::Diffs::push(Diffs *this,double x)

{
  double *pdVar1;
  double *pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  double *pdVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  double local_10;
  
  pdVar1 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (this->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  local_10 = x;
  if ((ulong)((long)pdVar1 - (long)pdVar2 >> 3) < this->_maxsize) {
    std::vector<double,_std::allocator<double>_>::push_back
              (&this->super_vector<double,_std::allocator<double>_>,&local_10);
    pdVar3 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pdVar4 = (this->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    (this->_pos)._M_current = pdVar3;
    if ((ulong)((long)pdVar3 - (long)pdVar4) < 9) {
      (this->_maxpos)._M_current = pdVar4;
      return;
    }
    if (pdVar3[-1] <= *(this->_maxpos)._M_current) {
      return;
    }
    _Var7._M_current = pdVar3 + -1;
  }
  else {
    pdVar6 = (this->_pos)._M_current;
    pdVar5 = (this->_maxpos)._M_current;
    if (pdVar6 == pdVar1) {
      pdVar6 = pdVar2;
    }
    if (pdVar5 != pdVar6) {
      if (*pdVar5 < x) {
        (this->_maxpos)._M_current = pdVar6;
      }
      (this->_pos)._M_current = pdVar6 + 1;
      *pdVar6 = x;
      return;
    }
    (this->_pos)._M_current = pdVar6 + 1;
    *pdVar6 = x;
    _Var7 = std::
            __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
  }
  (this->_maxpos)._M_current = _Var7._M_current;
  return;
}

Assistant:

void push(double x) {
                if( size() < _maxsize ) {
                    push_back(x);
                    _pos = end();
                    if( size() > 1 ) {
                        if( *_maxpos < back() ) {
                            _maxpos = end();
                            _maxpos--;
                        }
                    } else {
                        _maxpos = begin();
                    }
                }
                else {
                    if( _pos == end() )
                        _pos = begin();
                    if( _maxpos == _pos ) {
                        *_pos++ = x; 
                        _maxpos = max_element(begin(),end());
                    } else {
                        if( x > *_maxpos )
                            _maxpos = _pos;
                        *_pos++ = x;
                    }
                }
            }